

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O1

int mk_plugin_header_add(mk_http_request *sr,char *row,int len)

{
  char *pcVar1;
  int iVar2;
  iovec *piVar3;
  mk_iov *pmVar4;
  long lVar5;
  char *pcVar6;
  mk_http_request *pmVar7;
  unsigned_long uVar8;
  
  if (sr != (mk_http_request *)0x0) {
    if ((sr->headers)._extra_rows == (mk_iov *)0x0) {
      pmVar7 = (mk_http_request *)0x24;
      pcVar6 = (char *)0x0;
      pmVar4 = mk_iov_create(0x24,0);
      (sr->headers)._extra_rows = pmVar4;
      if (pmVar4 == (mk_iov *)0x0) goto LAB_00110a1c;
    }
    pmVar4 = (sr->headers)._extra_rows;
    piVar3 = pmVar4->io;
    iVar2 = pmVar4->iov_idx;
    lVar5 = (long)iVar2;
    piVar3[lVar5].iov_base = row;
    piVar3[lVar5].iov_len = (long)len;
    lVar5 = lVar5 + 1;
    pmVar4->iov_idx = (int)lVar5;
    uVar8 = (long)len + pmVar4->total_len;
    pmVar4->total_len = uVar8;
    piVar3[lVar5].iov_base = "\r\n";
    piVar3[lVar5].iov_len = 2;
    pmVar4->iov_idx = iVar2 + 2;
    pmVar4->total_len = uVar8 + 2;
    return 0;
  }
  mk_plugin_header_add_cold_2();
  pcVar6 = row;
  pmVar7 = sr;
LAB_00110a1c:
  mk_plugin_header_add_cold_1();
  pcVar1 = pcVar6 + 0x58;
  lVar5 = *(long *)&pmVar7->stream;
  *(char **)&pmVar7->stream = pcVar1;
  *(mk_stream **)(pcVar6 + 0x60) = &pmVar7->stream;
  *(long *)(pcVar6 + 0x58) = lVar5;
  *(char **)(lVar5 + 8) = pcVar1;
  return (int)pcVar1;
}

Assistant:

int mk_plugin_header_add(struct mk_http_request *sr, char *row, int len)
{
    mk_bug(!sr);

    if (!sr->headers._extra_rows) {
        /*
         * We allocate space for a fixed number of IOV entries:
         *
         *   MK_PLUGIN_HEADER_EXTRA_ROWS = X
         *
         *  we use (MK_PLUGIN_HEADER_EXTRA_ROWS * 2) thinking in an ending CRLF
         */
        sr->headers._extra_rows = mk_iov_create(MK_PLUGIN_HEADER_EXTRA_ROWS * 2, 0);
        mk_bug(!sr->headers._extra_rows);
    }

    mk_iov_add(sr->headers._extra_rows, row, len,
               MK_FALSE);
    mk_iov_add(sr->headers._extra_rows,
               mk_iov_crlf.data, mk_iov_crlf.len,
               MK_FALSE);
    return 0;
}